

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void nni_pipe_start(nni_pipe *p)

{
  nni_listener *pnVar1;
  nni_dialer *pnVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  nng_log_level nVar6;
  uint32_t uVar7;
  char *pcVar8;
  char *msg;
  char *msgid;
  nni_sock *pnVar9;
  nni_stat_item *item;
  char local_b8 [8];
  char addr [144];
  
  if ((p->p_listener != (nni_listener *)0x0) && (p->p_dialer != (nni_dialer *)0x0)) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
              0x602,"p->p_listener == NULL || p->p_dialer == NULL");
  }
  if ((p->p_listener == (nni_listener *)0x0) && (p->p_dialer == (nni_dialer *)0x0)) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
              0x603,"p->p_listener != NULL || p->p_dialer != NULL");
  }
  pnVar1 = p->p_listener;
  if (pnVar1 == (nni_listener *)0x0) {
    pnVar2 = p->p_dialer;
    if (pnVar2 == (nni_dialer *)0x0) {
      return;
    }
    pnVar9 = pnVar2->d_sock;
    nni_mtx_lock(&pnVar9->s_mx);
    pnVar2->d_pipe = p;
    pnVar2->d_currtime = pnVar2->d_inirtime;
    nni_mtx_unlock(&pnVar9->s_mx);
    nni_stat_inc(&pnVar9->st_pipes,1);
    nni_stat_inc(&pnVar2->st_pipes,1);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_PRE);
    _Var3 = nni_pipe_is_closed(p);
    if (_Var3) {
      nni_stat_inc(&pnVar2->st_reject,1);
      nni_stat_inc(&pnVar9->st_rejects,1);
      nVar6 = nng_log_get_level();
      if (NNG_LOG_INFO < nVar6) {
        uVar4 = nni_pipe_sock_id(p);
        pcVar8 = nni_pipe_peer_addr(p,local_b8);
        nng_log_debug("NNG-PIPEREJECT","Pipe on socket<%u> from %s rejected by callback",
                      (ulong)uVar4,pcVar8);
      }
      goto LAB_001183bc;
    }
    iVar5 = (*(p->p_proto_ops).pipe_start)(p->p_proto_data);
    if (iVar5 != 0) {
      item = &pnVar2->st_reject;
      goto LAB_0011828c;
    }
    nni_stat_set_id(&p->st_root,p->p_id);
    nni_stat_set_id(&p->st_id,p->p_id);
    nni_stat_register(&p->st_root);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_POST);
    nVar6 = nng_log_get_level();
    if (nVar6 < NNG_LOG_DEBUG) goto LAB_001183bc;
    uVar7 = nni_pipe_id(p);
    uVar4 = pnVar9->s_id;
    pcVar8 = nni_pipe_peer_addr(p,local_b8);
    msgid = "NNG-CONNECT";
    msg = "Connected pipe<%u> on socket<%u> to %s";
  }
  else {
    pnVar9 = pnVar1->l_sock;
    nni_stat_inc(&pnVar1->st_pipes,1);
    nni_stat_inc(&pnVar9->st_pipes,1);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_PRE);
    _Var3 = nni_pipe_is_closed(p);
    if (_Var3) {
      nni_stat_inc(&pnVar1->st_reject,1);
      nni_stat_inc(&pnVar9->st_rejects,1);
      goto LAB_001182b5;
    }
    iVar5 = (*(p->p_proto_ops).pipe_start)(p->p_proto_data);
    if (iVar5 != 0) {
      item = &pnVar1->st_reject;
LAB_0011828c:
      nni_stat_inc(item,1);
      nni_stat_inc(&pnVar9->st_rejects,1);
      nni_pipe_close(p);
LAB_001182b5:
      nni_pipe_rele(p);
      return;
    }
    nni_stat_set_id(&p->st_root,p->p_id);
    nni_stat_set_id(&p->st_id,p->p_id);
    nni_stat_register(&p->st_root);
    nni_pipe_run_cb(p,NNG_PIPE_EV_ADD_POST);
    nVar6 = nng_log_get_level();
    if (nVar6 < NNG_LOG_DEBUG) goto LAB_001183bc;
    uVar7 = nni_pipe_id(p);
    uVar4 = pnVar9->s_id;
    pcVar8 = nni_pipe_peer_addr(p,local_b8);
    msgid = "NNG-ACCEPT";
    msg = "Accepted pipe<%u> on socket<%u> from %s";
  }
  nng_log_debug(msgid,msg,(ulong)uVar7,(ulong)uVar4,pcVar8);
LAB_001183bc:
  nni_pipe_rele(p);
  return;
}

Assistant:

void
nni_pipe_start(nni_pipe *p)
{
	// exactly one of these must be set.
	NNI_ASSERT(p->p_listener == NULL || p->p_dialer == NULL);
	NNI_ASSERT(p->p_listener != NULL || p->p_dialer != NULL);

	// NB: starting the pipe can actually cause the pipe
	// to be deallocated before this returns (if it is rejected)
	if (p->p_listener) {
		listener_start_pipe(p->p_listener, p);
	} else if (p->p_dialer) {
		dialer_start_pipe(p->p_dialer, p);
	}
}